

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl10.c
# Opt level: O3

size_t th10_instr_size(uint version,thecl_instr_t *instr,_Bool is_timeline)

{
  int iVar1;
  list_node_t *plVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  undefined3 in_register_00000011;
  size_t sVar6;
  
  if (CONCAT31(in_register_00000011,is_timeline) == 0) {
    sVar6 = 0x10;
    for (plVar2 = (instr->params).head; plVar2 != (list_node_t *)0x0; plVar2 = plVar2->next) {
      piVar3 = (int *)plVar2->data;
      iVar1 = *piVar3;
      lVar4 = 4;
      if (iVar1 < 0x74) {
        if (iVar1 == 0x6d) {
LAB_0011ace0:
          if (g_ecl_encode_cp932 == true) {
            uVar5 = utf8_to_cp932_len(*(char **)(piVar3 + 4));
          }
          else {
            uVar5 = strlen(*(char **)(piVar3 + 4));
          }
          lVar4 = (uVar5 & 0xfffffffffffffffc) + 8;
        }
        else if (iVar1 != 0x6f) {
LAB_0011acf1:
          lVar4 = value_size((value_t *)(piVar3 + 2));
        }
      }
      else if (iVar1 != 0x74) {
        if (iVar1 != 0x78) goto LAB_0011acf1;
        goto LAB_0011ace0;
      }
      sVar6 = sVar6 + lVar4;
    }
  }
  else {
    sVar6 = 0;
  }
  return sVar6;
}

Assistant:

static size_t
th10_instr_size(
    unsigned int version,
    const thecl_instr_t* instr,
    bool is_timeline)
{
    (void)version;
    if (is_timeline) return 0;

    size_t ret = sizeof(th10_instr_t);
    thecl_param_t* param;

    list_for_each(&instr->params, param) {
        /* XXX: I think 'z' is what will be passed ... */
        if (param->type == 'm' || param->type == 'x') {
            size_t zlen = g_ecl_encode_cp932 ? utf8_to_cp932_len(param->value.val.z) : strlen(param->value.val.z);
            ret += sizeof(uint32_t) + zlen + (4 - (zlen % 4));
        } else if (param->type == 'o' || param->type == 't') {
            ret += sizeof(uint32_t);
        } else {
            ret += value_size(&param->value);
        }
    }

    return ret;
}